

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void jpeg_gen_optimal_table(j_compress_ptr cinfo,JHUFF_TBL *htbl,long *freq)

{
  long in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  long v;
  int j;
  int i;
  int p;
  int c2;
  int c1;
  int others [257];
  int codesize [257];
  UINT8 bits [33];
  long local_888;
  int local_87c;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  int aiStack_868 [260];
  int local_458 [260];
  undefined8 local_48;
  undefined8 local_40;
  char local_38 [32];
  long local_18;
  undefined8 *local_10;
  long *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_48,0,0x21);
  memset(local_458,0,0x404);
  for (local_878 = 0; local_878 < 0x101; local_878 = local_878 + 1) {
    aiStack_868[local_878] = -1;
  }
  *(undefined8 *)(local_18 + 0x800) = 1;
  while( true ) {
    local_86c = -1;
    local_888 = 1000000000;
    for (local_878 = 0; local_878 < 0x101; local_878 = local_878 + 1) {
      if ((*(long *)(local_18 + (long)local_878 * 8) != 0) &&
         (*(long *)(local_18 + (long)local_878 * 8) <= local_888)) {
        local_888 = *(long *)(local_18 + (long)local_878 * 8);
        local_86c = local_878;
      }
    }
    local_870 = -1;
    local_888 = 1000000000;
    for (local_878 = 0; local_878 < 0x101; local_878 = local_878 + 1) {
      if (((*(long *)(local_18 + (long)local_878 * 8) != 0) &&
          (*(long *)(local_18 + (long)local_878 * 8) <= local_888)) && (local_878 != local_86c)) {
        local_888 = *(long *)(local_18 + (long)local_878 * 8);
        local_870 = local_878;
      }
    }
    if (local_870 < 0) break;
    *(long *)(local_18 + (long)local_86c * 8) =
         *(long *)(local_18 + (long)local_870 * 8) + *(long *)(local_18 + (long)local_86c * 8);
    *(undefined8 *)(local_18 + (long)local_870 * 8) = 0;
    local_458[local_86c] = local_458[local_86c] + 1;
    while (-1 < aiStack_868[local_86c]) {
      local_86c = aiStack_868[local_86c];
      local_458[local_86c] = local_458[local_86c] + 1;
    }
    aiStack_868[local_86c] = local_870;
    local_458[local_870] = local_458[local_870] + 1;
    while (-1 < aiStack_868[local_870]) {
      local_870 = aiStack_868[local_870];
      local_458[local_870] = local_458[local_870] + 1;
    }
  }
  for (local_878 = 0; local_878 < 0x101; local_878 = local_878 + 1) {
    if (local_458[local_878] != 0) {
      if (0x20 < local_458[local_878]) {
        *(undefined4 *)(*local_8 + 0x28) = 0x27;
        (**(code **)*local_8)(local_8);
      }
      *(char *)((long)&local_48 + (long)local_458[local_878]) =
           *(char *)((long)&local_48 + (long)local_458[local_878]) + '\x01';
    }
  }
  for (local_878 = 0x20; 0x10 < local_878; local_878 = local_878 + -1) {
    while (*(char *)((long)&local_48 + (long)local_878) != '\0') {
      for (local_87c = local_878 + -2; *(char *)((long)&local_48 + (long)local_87c) == '\0';
          local_87c = local_87c + -1) {
      }
      *(char *)((long)&local_48 + (long)local_878) =
           *(char *)((long)&local_48 + (long)local_878) + -2;
      *(char *)((long)&local_48 + (long)(local_878 + -1)) =
           *(char *)((long)&local_48 + (long)(local_878 + -1)) + '\x01';
      *(char *)((long)&local_48 + (long)(local_87c + 1)) =
           *(char *)((long)&local_48 + (long)(local_87c + 1)) + '\x02';
      *(char *)((long)&local_48 + (long)local_87c) =
           *(char *)((long)&local_48 + (long)local_87c) + -1;
    }
  }
  for (; *(char *)((long)&local_48 + (long)local_878) == '\0'; local_878 = local_878 + -1) {
  }
  *(char *)((long)&local_48 + (long)local_878) = *(char *)((long)&local_48 + (long)local_878) + -1;
  *local_10 = local_48;
  local_10[1] = local_40;
  *(char *)(local_10 + 2) = local_38[0];
  local_874 = 0;
  for (local_878 = 1; local_878 < 0x21; local_878 = local_878 + 1) {
    for (local_87c = 0; local_87c < 0x100; local_87c = local_87c + 1) {
      if (local_458[local_87c] == local_878) {
        *(char *)((long)local_10 + (long)local_874 + 0x11) = (char)local_87c;
        local_874 = local_874 + 1;
      }
    }
  }
  *(undefined4 *)((long)local_10 + 0x114) = 0;
  return;
}

Assistant:

GLOBAL(void)
jpeg_gen_optimal_table(j_compress_ptr cinfo, JHUFF_TBL *htbl, long freq[])
{
#define MAX_CLEN  32            /* assumed maximum initial code length */
  UINT8 bits[MAX_CLEN + 1];     /* bits[k] = # of symbols with code length k */
  int codesize[257];            /* codesize[k] = code length of symbol k */
  int others[257];              /* next symbol in current branch of tree */
  int c1, c2;
  int p, i, j;
  long v;

  /* This algorithm is explained in section K.2 of the JPEG standard */

  MEMZERO(bits, sizeof(bits));
  MEMZERO(codesize, sizeof(codesize));
  for (i = 0; i < 257; i++)
    others[i] = -1;             /* init links to empty */

  freq[256] = 1;                /* make sure 256 has a nonzero count */
  /* Including the pseudo-symbol 256 in the Huffman procedure guarantees
   * that no real symbol is given code-value of all ones, because 256
   * will be placed last in the largest codeword category.
   */

  /* Huffman's basic algorithm to assign optimal code lengths to symbols */

  for (;;) {
    /* Find the smallest nonzero frequency, set c1 = its symbol */
    /* In case of ties, take the larger symbol number */
    c1 = -1;
    v = 1000000000L;
    for (i = 0; i <= 256; i++) {
      if (freq[i] && freq[i] <= v) {
        v = freq[i];
        c1 = i;
      }
    }

    /* Find the next smallest nonzero frequency, set c2 = its symbol */
    /* In case of ties, take the larger symbol number */
    c2 = -1;
    v = 1000000000L;
    for (i = 0; i <= 256; i++) {
      if (freq[i] && freq[i] <= v && i != c1) {
        v = freq[i];
        c2 = i;
      }
    }

    /* Done if we've merged everything into one frequency */
    if (c2 < 0)
      break;

    /* Else merge the two counts/trees */
    freq[c1] += freq[c2];
    freq[c2] = 0;

    /* Increment the codesize of everything in c1's tree branch */
    codesize[c1]++;
    while (others[c1] >= 0) {
      c1 = others[c1];
      codesize[c1]++;
    }

    others[c1] = c2;            /* chain c2 onto c1's tree branch */

    /* Increment the codesize of everything in c2's tree branch */
    codesize[c2]++;
    while (others[c2] >= 0) {
      c2 = others[c2];
      codesize[c2]++;
    }
  }

  /* Now count the number of symbols of each code length */
  for (i = 0; i <= 256; i++) {
    if (codesize[i]) {
      /* The JPEG standard seems to think that this can't happen, */
      /* but I'm paranoid... */
      if (codesize[i] > MAX_CLEN)
        ERREXIT(cinfo, JERR_HUFF_CLEN_OVERFLOW);

      bits[codesize[i]]++;
    }
  }

  /* JPEG doesn't allow symbols with code lengths over 16 bits, so if the pure
   * Huffman procedure assigned any such lengths, we must adjust the coding.
   * Here is what Rec. ITU-T T.81 | ISO/IEC 10918-1 says about how this next
   * bit works: Since symbols are paired for the longest Huffman code, the
   * symbols are removed from this length category two at a time.  The prefix
   * for the pair (which is one bit shorter) is allocated to one of the pair;
   * then, skipping the BITS entry for that prefix length, a code word from the
   * next shortest nonzero BITS entry is converted into a prefix for two code
   * words one bit longer.
   */

  for (i = MAX_CLEN; i > 16; i--) {
    while (bits[i] > 0) {
      j = i - 2;                /* find length of new prefix to be used */
      while (bits[j] == 0)
        j--;

      bits[i] -= 2;             /* remove two symbols */
      bits[i - 1]++;            /* one goes in this length */
      bits[j + 1] += 2;         /* two new symbols in this length */
      bits[j]--;                /* symbol of this length is now a prefix */
    }
  }

  /* Remove the count for the pseudo-symbol 256 from the largest codelength */
  while (bits[i] == 0)          /* find largest codelength still in use */
    i--;
  bits[i]--;

  /* Return final symbol counts (only for lengths 0..16) */
  MEMCOPY(htbl->bits, bits, sizeof(htbl->bits));

  /* Return a list of the symbols sorted by code length */
  /* It's not real clear to me why we don't need to consider the codelength
   * changes made above, but Rec. ITU-T T.81 | ISO/IEC 10918-1 seems to think
   * this works.
   */
  p = 0;
  for (i = 1; i <= MAX_CLEN; i++) {
    for (j = 0; j <= 255; j++) {
      if (codesize[j] == i) {
        htbl->huffval[p] = (UINT8)j;
        p++;
      }
    }
  }

  /* Set sent_table FALSE so updated table will be written to JPEG file. */
  htbl->sent_table = FALSE;
}